

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

int lj_trace_exit(jit_State *J,void *exptr)

{
  int iVar1;
  int iVar2;
  lua_State *L_00;
  TValue *pTVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  ptrdiff_t argbase_00;
  ulong uVar7;
  uint *puVar8;
  bool bVar9;
  int isret;
  BCIns *retpc;
  ptrdiff_t argbase;
  GCtrace *T;
  void *cf;
  BCIns *pc;
  TValue exiterr;
  int exitcode;
  int errcode;
  ExitDataCP exd;
  ExitState *ex;
  lua_State *L;
  int olderr;
  void *exptr_local;
  jit_State *J_local;
  
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  L_00 = J->L;
  iVar2 = J->exitcode;
  pc = (BCIns *)0xffffffffffffffff;
  if (iVar2 != 0) {
    J->exitcode = 0;
    pc = *(BCIns **)(L_00->top + -1);
  }
  _exitcode = J;
  exd.J = (jit_State *)exptr;
  exd.pc = (BCIns *)exptr;
  iVar4 = lj_vm_cpcall(L_00,0,&exitcode,trace_exit_cp);
  if (iVar4 == 0) {
    if (iVar2 != 0) {
      pTVar3 = L_00->top;
      L_00->top = pTVar3 + 1;
      *pTVar3 = (TValue)pc;
    }
    if ((((*(byte *)((L_00->glref).ptr64 + 0x91) & 0x80) == 0) &&
        ((*(byte *)((L_00->glref).ptr64 + 0x93) & 8) != 0)) &&
       (argbase_00 = lj_vmevent_prepare(L_00,LJ_VMEVENT_TEXIT), argbase_00 != 0)) {
      if ((long)((L_00->maxstack).ptr64 - (long)L_00->top) < 0x1c1) {
        lj_state_growstack(L_00,0x38);
      }
      pTVar3 = L_00->top;
      L_00->top = pTVar3 + 1;
      pTVar3->n = (double)(int)J->parent;
      pTVar3 = L_00->top;
      L_00->top = pTVar3 + 1;
      pTVar3->n = (double)(int)J->exitno;
      trace_exit_regs(L_00,(ExitState *)exd.pc);
      lj_vmevent_call(L_00,argbase_00);
    }
    cf = exd.exptr;
    uVar7 = (ulong)L_00->cframe & 0xfffffffffffffffc;
    *(void **)(uVar7 + 0x18) = exd.exptr;
    if (iVar2 == 0) {
      if ((*(byte *)((L_00->glref).ptr64 + 0x91) & 0x80) == 0) {
        if ((*(char *)((L_00->glref).ptr64 + 0x21) == '\x02') ||
           (*(char *)((L_00->glref).ptr64 + 0x21) == '\x05')) {
          if ((*(byte *)((L_00->glref).ptr64 + 0x91) & 0x40) == 0) {
            lj_gc_step(L_00);
          }
        }
        else {
          trace_hotside(J,(BCIns *)exd.exptr);
        }
      }
      if ((*exd.exptr & 0xff) == 0x57) {
        puVar8 = (uint *)(J->trace[*exd.exptr >> 0x10].gcptr64 + 0x50);
        uVar5 = *puVar8 & 0xff;
        bVar9 = true;
        if (((uVar5 != 0x49) && (bVar9 = true, uVar5 != 0x4a)) && (bVar9 = true, uVar5 != 0x4b)) {
          bVar9 = uVar5 == 0x4c;
        }
        if ((bVar9) || ((*puVar8 & 0xff) == 0x46)) {
          if (J->state == LJ_TRACE_RECORD) {
            J->patchins = *exd.exptr;
            J->patchpc = (BCIns *)exd.exptr;
            *J->patchpc = *puVar8;
            J->bcskip = '\x01';
          }
          else if (bVar9) {
            *(uint **)(uVar7 + 0x18) = puVar8;
            cf = puVar8;
          }
        }
      }
      piVar6 = __errno_location();
      *piVar6 = iVar1;
      switch(*cf) {
      case 0x3f:
        J_local._0_4_ = ((int)((long)L_00->top - (long)L_00->base >> 3) + 1) - (*cf >> 8 & 0xff);
        break;
      default:
        if ((*cf & 0xff) < 0x59) {
          J_local._0_4_ = 0;
        }
        else {
          J_local._0_4_ = (int)((long)L_00->top - (long)L_00->base >> 3) + 1;
        }
        break;
      case 0x41:
      case 0x43:
        J_local._0_4_ =
             (((int)((long)L_00->top - (long)L_00->base >> 3) - (*cf >> 8 & 0xff)) -
             (*cf >> 0x10 & 0xff)) + -1;
        break;
      case 0x49:
        J_local._0_4_ =
             (((int)((long)L_00->top - (long)L_00->base >> 3) + 1) - (*cf >> 8 & 0xff)) -
             (*cf >> 0x10);
      }
    }
    else {
      J_local._0_4_ = -iVar2;
    }
  }
  else {
    J_local._0_4_ = -iVar4;
  }
  return (int)J_local;
}

Assistant:

int LJ_FASTCALL lj_trace_exit(jit_State *J, void *exptr)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  ExitState *ex = (ExitState *)exptr;
  ExitDataCP exd;
  int errcode, exitcode = J->exitcode;
  TValue exiterr;
  const BCIns *pc;
  void *cf;
  GCtrace *T;

  setnilV(&exiterr);
  if (exitcode) {  /* Trace unwound with error code. */
    J->exitcode = 0;
    copyTV(L, &exiterr, L->top-1);
  }

#ifdef EXITSTATE_PCREG
  J->parent = trace_exit_find(J, (MCode *)(intptr_t)ex->gpr[EXITSTATE_PCREG]);
#endif
  T = traceref(J, J->parent); UNUSED(T);
#ifdef EXITSTATE_CHECKEXIT
  if (J->exitno == T->nsnap) {  /* Treat stack check like a parent exit. */
    lj_assertJ(T->root != 0, "stack check in root trace");
    J->exitno = T->ir[REF_BASE].op2;
    J->parent = T->ir[REF_BASE].op1;
    T = traceref(J, J->parent);
  }
#endif
  lj_assertJ(T != NULL && J->exitno < T->nsnap, "bad trace or exit number");
  exd.J = J;
  exd.exptr = exptr;
  errcode = lj_vm_cpcall(L, NULL, &exd, trace_exit_cp);
  if (errcode)
    return -errcode;  /* Return negated error code. */

  if (exitcode) copyTV(L, L->top++, &exiterr);  /* Anchor the error object. */

  if (!(LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)))
    lj_vmevent_send(L, TEXIT,
      lj_state_checkstack(L, 4+RID_NUM_GPR+RID_NUM_FPR+LUA_MINSTACK);
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
      trace_exit_regs(L, ex);
    );

  pc = exd.pc;
  cf = cframe_raw(L->cframe);
  setcframe_pc(cf, pc);
  if (exitcode) {
    return -exitcode;
  } else if (LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)) {
    /* Just exit to interpreter. */
  } else if (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize) {
    if (!(G(L)->hookmask & HOOK_GC))
      lj_gc_step(L);  /* Exited because of GC: drive GC forward. */
  } else {
    trace_hotside(J, pc);
  }
  if (bc_op(*pc) == BC_JLOOP) {
    BCIns *retpc = &traceref(J, bc_d(*pc))->startins;
    int isret = bc_isret(bc_op(*retpc));
    if (isret || bc_op(*retpc) == BC_ITERN) {
      if (J->state == LJ_TRACE_RECORD) {
	J->patchins = *pc;
	J->patchpc = (BCIns *)pc;
	*J->patchpc = *retpc;
	J->bcskip = 1;
      } else if (isret) {
	pc = retpc;
	setcframe_pc(cf, pc);
      }
    }
  }
#ifdef LUA_USE_TRACE_LOGS
  lj_log_trace_normal_exit(L, (int) T->traceno, pc);
#endif
  /* Return MULTRES or 0. */
  ERRNO_RESTORE
  switch (bc_op(*pc)) {
  case BC_CALLM: case BC_CALLMT:
    return (int)((BCReg)(L->top - L->base) - bc_a(*pc) - bc_c(*pc) - LJ_FR2);
  case BC_RETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc) - bc_d(*pc));
  case BC_TSETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc));
  default:
    if (bc_op(*pc) >= BC_FUNCF)
      return (int)((BCReg)(L->top - L->base) + 1);
    return 0;
  }
}